

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-textblock.c
# Opt level: O1

void textblock_append_textblock(textblock *tb,textblock *tba)

{
  textblock_resize_if_needed(tb,tba->strlen);
  memcpy(tb->text + tb->strlen,tba->text,tba->strlen << 2);
  memcpy(tb->attrs + tb->strlen,tba->attrs,tba->strlen);
  tb->strlen = tb->strlen + tba->strlen;
  return;
}

Assistant:

void textblock_append_textblock(textblock *tb, const textblock *tba)
{
	textblock_resize_if_needed(tb, tba->strlen);
	(void) memcpy(tb->text + tb->strlen, tba->text,
		tba->strlen * sizeof(*tb->text));
	(void) memcpy(tb->attrs + tb->strlen, tba->attrs, tba->strlen);
	tb->strlen += tba->strlen;
}